

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

art_iterator_t *
art_upper_bound(art_iterator_t *__return_storage_ptr__,art_t *art,art_key_chunk_t *key)

{
  _Bool _Var1;
  
  memset(__return_storage_ptr__,0,0x90);
  __return_storage_ptr__->art = art;
  if (art->root != 0) {
    _Var1 = art_node_iterator_lower_bound(art->root,__return_storage_ptr__,key);
    if ((_Var1) &&
       (*(short *)(__return_storage_ptr__->key + 4) == *(short *)(key + 4) &&
        *(int *)__return_storage_ptr__->key == *(int *)key)) {
      art_iterator_move(__return_storage_ptr__,true);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

art_iterator_t art_upper_bound(art_t *art, const art_key_chunk_t *key) {
    art_iterator_t iterator = CROARING_ZERO_INITIALIZER;
    iterator.art = art;
    if (art->root != CROARING_ART_NULL_REF) {
        if (art_node_iterator_lower_bound(art->root, &iterator, key) &&
            art_compare_keys(iterator.key, key) == 0) {
            art_iterator_next(&iterator);
        }
    }
    return iterator;
}